

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

bool rsg::SinOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  float fVar1;
  bool bVar2;
  
  bVar2 = outMin <= 1.0 && -1.0 <= outMax;
  if (bVar2) {
    if (-1.0 <= outMin) {
      fVar1 = asinf(outMin);
    }
    else {
      fVar1 = -1.5707964;
    }
    *inMin = fVar1;
    if (outMax <= 1.0) {
      fVar1 = asinf(outMax);
    }
    else {
      fVar1 = 1.5707964;
    }
    *inMax = fVar1;
  }
  return bVar2;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		if (outMax < -1.0f || outMin > 1.0f)
			return false;

		inMin = (outMin >= -1.0f) ? deFloatAsin(outMin) : -0.5f*DE_PI;
		inMax = (outMax <= +1.0f) ? deFloatAsin(outMax) : +0.5f*DE_PI;

		return true;
	}